

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avs_wrapper.hpp
# Opt level: O3

void __thiscall
AVSInterface::AVSInDelegator::AVSInDelegator
          (AVSInDelegator *this,AVSValue *args,vector<Param,_std::allocator<Param>_> *params)

{
  pointer pPVar1;
  code *pcVar2;
  mapped_type *pmVar3;
  pointer pPVar4;
  int iVar5;
  allocator<char> local_59;
  AVSValue *local_58;
  key_type local_50;
  
  (this->super_InDelegator)._vptr_InDelegator = (_func_int **)&PTR_Read_00116b80;
  if ((AVS_linkage != (AVS_Linkage *)0x0) && (0x4d8 < (uint)AVS_linkage->Size)) {
    pcVar2 = (code *)AVS_linkage->AVSValue_CONSTRUCTOR9;
    if (((ulong)pcVar2 & 1) != 0) {
      pcVar2 = *(code **)(pcVar2 + *(long *)((long)&(this->_args).type +
                                            *(long *)&AVS_linkage->field_0x4e0) + -1);
    }
    (*pcVar2)();
  }
  (this->_params_index_map)._M_h._M_buckets = &(this->_params_index_map)._M_h._M_single_bucket;
  (this->_params_index_map)._M_h._M_bucket_count = 1;
  (this->_params_index_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->_params_index_map)._M_h._M_element_count = 0;
  (this->_params_index_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->_params_index_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->_params_index_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pPVar4 = (params->super__Vector_base<Param,_std::allocator<Param>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pPVar1 = (params->super__Vector_base<Param,_std::allocator<Param>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pPVar4 != pPVar1) {
    iVar5 = 0;
    local_58 = &this->_args;
    do {
      if (pPVar4->AVSEnabled == true) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,pPVar4->Name,&local_59);
        pmVar3 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&this->_params_index_map,&local_50);
        *pmVar3 = iVar5;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        iVar5 = iVar5 + 1;
      }
      pPVar4 = pPVar4 + 1;
    } while (pPVar4 != pPVar1);
  }
  return;
}

Assistant:

AVSInDelegator(const AVSValue args, std::vector<Param> params) : _args(args)
    {
      int idx = 0;
      for (auto &&param : params)
      {
        if (!param.AVSEnabled) continue;
        _params_index_map[param.Name] = idx++;
      }
    }